

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

void flatbuffers::(anonymous_namespace)::
     SimpleQsort<flatbuffers::Offset<flatbuffers::Table>,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__4,void(*)(flatbuffers::Offset<flatbuffers::Table>*,flatbuffers::Offset<flatbuffers::Table>*)>
               (Offset<flatbuffers::Table> *begin,Offset<flatbuffers::Table> *end,size_t width,
               anon_class_8_1_ba1d59bf comparator,
               _func_void_Offset<flatbuffers::Table>_ptr_Offset<flatbuffers::Table>_ptr *swapper)

{
  voffset_t field;
  uint uVar1;
  bool bVar2;
  uint8_t *a;
  uint8_t *b;
  Offset<flatbuffers::Table> *a_00;
  Offset<flatbuffers::Table> *local_40;
  
  while (4 < (long)end - (long)begin) {
    a_00 = begin + 1;
    local_40 = end;
    while (a_00 < local_40) {
      field = *(voffset_t *)(width + 0x108);
      uVar1 = a_00->o;
      a = Table::GetAddressOf((Table *)((long)&begin->o + (ulong)begin->o),field);
      b = Table::GetAddressOf((Table *)((long)&a_00->o + (ulong)uVar1),field);
      bVar2 = anon_unknown_0::CompareSerializedScalars(a,b,(FieldDef *)width);
      if (bVar2) {
        local_40 = local_40 + -1;
        anon_unknown_0::SwapSerializedTables(a_00,local_40);
      }
      else {
        a_00 = a_00 + 1;
      }
    }
    anon_unknown_0::SwapSerializedTables(begin,a_00 + -1);
    SimpleQsort<flatbuffers::Offset<flatbuffers::Table>,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__4,void(*)(flatbuffers::Offset<flatbuffers::Table>*,flatbuffers::Offset<flatbuffers::Table>*)>
              (begin,a_00 + -1,width,comparator,swapper);
    begin = local_40;
  }
  return;
}

Assistant:

static void SimpleQsort(T *begin, T *end, size_t width, F comparator,
                        S swapper) {
  if (end - begin <= static_cast<ptrdiff_t>(width)) return;
  auto l = begin + width;
  auto r = end;
  while (l < r) {
    if (comparator(begin, l)) {
      r -= width;
      swapper(l, r);
    } else {
      l += width;
    }
  }
  l -= width;
  swapper(begin, l);
  SimpleQsort(begin, l, width, comparator, swapper);
  SimpleQsort(r, end, width, comparator, swapper);
}